

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O0

_Bool rtree_write(tsdn_t *tsdn,rtree_t *rtree,rtree_ctx_t *rtree_ctx,uintptr_t key,extent_t *extent,
                 szind_t szind,_Bool slab)

{
  long lVar1;
  rtree_t *rtree_00;
  rtree_ctx_t *rtree_ctx_00;
  ulong in_RCX;
  long in_RDX;
  rtree_t *in_RSI;
  tsdn_t *in_RDI;
  extent_t *in_R8;
  szind_t in_R9D;
  rtree_leaf_elm_t *elm;
  byte in_stack_00000008;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  undefined1 local_129;
  undefined4 local_114;
  undefined8 in_stack_ffffffffffffff00;
  uintptr_t in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff20;
  undefined8 local_b8;
  
  rtree_00 = (rtree_t *)(in_RCX >> 0x1e & 0xf);
  rtree_ctx_00 = (rtree_ctx_t *)(in_RCX & 0xffffffffc0000000);
  if (*(rtree_ctx_t **)(in_RDX + (long)rtree_00 * 0x10) == rtree_ctx_00) {
    local_b8 = (rtree_leaf_elm_t *)
               (*(long *)(in_RDX + (long)rtree_00 * 0x10 + 8) + (in_RCX >> 0xc & 0x3ffff) * 8);
  }
  else if (*(rtree_ctx_t **)(in_RDX + 0x100) == rtree_ctx_00) {
    lVar1 = *(long *)(in_RDX + 0x108);
    *(undefined8 *)(in_RDX + 0x100) = *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10);
    *(undefined8 *)(in_RDX + 0x108) = *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10 + 8);
    *(rtree_ctx_t **)(in_RDX + (long)rtree_00 * 0x10) = rtree_ctx_00;
    *(long *)(in_RDX + (long)rtree_00 * 0x10 + 8) = lVar1;
    local_b8 = (rtree_leaf_elm_t *)(lVar1 + (in_RCX >> 0xc & 0x3ffff) * 8);
  }
  else {
    for (local_114 = 1; local_114 < 8; local_114 = local_114 + 1) {
      if (*(rtree_ctx_t **)(in_RDX + 0x100 + (ulong)local_114 * 0x10) == rtree_ctx_00) {
        lVar1 = *(long *)(in_RDX + (ulong)local_114 * 0x10 + 0x108);
        if (local_114 == 0) {
          *(undefined8 *)(in_RDX + 0x100) = *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10);
          *(undefined8 *)(in_RDX + 0x108) = *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10 + 8);
        }
        else {
          *(undefined8 *)(in_RDX + 0x100 + (ulong)local_114 * 0x10) =
               *(undefined8 *)(in_RDX + 0x100 + (ulong)(local_114 - 1) * 0x10);
          *(undefined8 *)(in_RDX + (ulong)local_114 * 0x10 + 0x108) =
               *(undefined8 *)(in_RDX + (ulong)(local_114 - 1) * 0x10 + 0x108);
          *(undefined8 *)(in_RDX + 0x100 + (ulong)(local_114 - 1) * 0x10) =
               *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10);
          *(undefined8 *)(in_RDX + (ulong)(local_114 - 1) * 0x10 + 0x108) =
               *(undefined8 *)(in_RDX + (long)rtree_00 * 0x10 + 8);
        }
        *(rtree_ctx_t **)(in_RDX + (long)rtree_00 * 0x10) = rtree_ctx_00;
        *(long *)(in_RDX + (long)rtree_00 * 0x10 + 8) = lVar1;
        local_b8 = (rtree_leaf_elm_t *)(lVar1 + (in_RCX >> 0xc & 0x3ffff) * 8);
        goto LAB_00172fdd;
      }
    }
    local_b8 = rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)(ulong)CONCAT16(1,in_stack_ffffffffffffff20),rtree_00,
                          rtree_ctx_00,in_stack_ffffffffffffff08,
                          SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0),
                          SUB81((ulong)in_stack_ffffffffffffff00 >> 0x30,0));
  }
LAB_00172fdd:
  if (local_b8 != (rtree_leaf_elm_t *)0x0) {
    rtree_leaf_elm_write(in_RDI,in_RSI,local_b8,in_R8,in_R9D,(_Bool)(in_stack_00000008 & 1));
  }
  local_129 = local_b8 == (rtree_leaf_elm_t *)0x0;
  return local_129;
}

Assistant:

static inline bool
rtree_write(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx, uintptr_t key,
    extent_t *extent, szind_t szind, bool slab) {
	/* Use rtree_clear() to set the extent to NULL. */
	assert(extent != NULL);

	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, rtree, rtree_ctx,
	    key, false, true);
	if (elm == NULL) {
		return true;
	}

	assert(rtree_leaf_elm_extent_read(tsdn, rtree, elm, false) == NULL);
	rtree_leaf_elm_write(tsdn, rtree, elm, extent, szind, slab);

	return false;
}